

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLNodeLinOp::define
          (MLNodeLinOp *this,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *a_grids,
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *a_dmap,
          LPInfo *a_info,
          Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
          *a_factory,int a_eb_limit_coarsening)

{
  Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  *this_00;
  int iVar1;
  long lVar2;
  long *plVar3;
  iMultiFab *piVar4;
  pointer puVar5;
  tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> tVar6;
  pointer puVar7;
  tuple<amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_> tVar8;
  DistributionMapping *cdm;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  int mglev;
  long lVar12;
  long local_2c8;
  undefined1 local_2b4 [20];
  IntVect local_2a0;
  IntVect local_294;
  BoxArray local_288;
  BoxArray local_220;
  undefined1 local_1b8 [392];
  
  MLLinOp::define(&this->super_MLLinOp,a_geom,a_grids,a_dmap,a_info,a_factory,
                  0 < a_eb_limit_coarsening);
  if ((uint)(this->super_MLLinOp).info.hidden_direction < 3) {
    Assert_host("!hasHiddenDimension()",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLinOp.cpp"
                ,0x2a,"\"Nodal solver cannot have any hidden dimensions\"");
  }
  this_00 = &this->m_dirichlet_mask;
  std::
  vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  ::resize(&this_00->
            super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  for (lVar10 = 0; lVar10 < (this->super_MLLinOp).m_num_amr_levels; lVar10 = lVar10 + 1) {
    std::
    vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
    ::resize(&(this->m_dirichlet_mask).
              super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
              .
              super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar10].
              super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             ,(long)(this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[lVar10]);
    local_2c8 = 0;
    lVar11 = 0;
    lVar12 = 0;
    while( true ) {
      if ((this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [lVar10] <= lVar12) break;
      local_220.m_bat._0_8_ =
           (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)0x100000001;
      local_220.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)1;
      convert((BoxArray *)local_1b8,
              (BoxArray *)
              (*(long *)&(this->super_MLLinOp).m_grids.
                         super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar10].
                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> +
              lVar11),(IntVect *)&local_220);
      local_2b4._0_4_ = 1;
      local_2a0.vect._0_8_ = local_2a0.vect._0_8_ & 0xffffffff00000000;
      std::make_unique<amrex::iMultiFab,amrex::BoxArray,amrex::DistributionMapping&,int,int>
                (&local_288,(DistributionMapping *)local_1b8,
                 (int *)(*(long *)&(this->super_MLLinOp).m_dmap.
                                   super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                   .
                                   super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar10].
                                   super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                   .
                                   super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        + local_2c8),(int *)local_2b4);
      uVar9 = local_288.m_bat._0_8_;
      lVar2 = *(long *)&(this_00->
                        super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                        ).
                        super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar10].
                        super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ;
      local_288.m_bat._0_8_ =
           (_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)0x0;
      plVar3 = *(long **)(lVar2 + lVar12 * 8);
      ((tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)(lVar2 + lVar12 * 8))->
      super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> =
           (_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)uVar9;
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 8))();
      }
      if ((iMultiFab *)local_288.m_bat._0_8_ != (iMultiFab *)0x0) {
        (**(code **)(*(long *)local_288.m_bat._0_8_ + 8))();
      }
      local_288.m_bat._0_8_ =
           (_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)0x0;
      BoxArray::~BoxArray((BoxArray *)local_1b8);
      FabArray<amrex::IArrayBox>::setVal<amrex::IArrayBox,_0>
                (*(FabArray<amrex::IArrayBox> **)
                  (*(long *)&(this_00->
                             super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                             ).
                             super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar10].
                             super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                             .
                             super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  + lVar12 * 8),0);
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x68;
      local_2c8 = local_2c8 + 0x10;
    }
  }
  makeOwnerMask((MLNodeLinOp *)local_1b8,
                *(BoxArray **)
                 &(((this->super_MLLinOp).m_grids.
                    super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
                *(DistributionMapping **)
                 &(((this->super_MLLinOp).m_dmap.
                    super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                  ).
                  super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                ,*(Geometry **)
                  &(((this->super_MLLinOp).m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>);
  uVar9 = local_1b8._0_8_;
  local_1b8._0_8_ = (iMultiFab *)0x0;
  piVar4 = (this->m_owner_mask_top)._M_t.
           super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
           super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
  (this->m_owner_mask_top)._M_t.
  super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
  super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl = (iMultiFab *)uVar9;
  if (piVar4 != (iMultiFab *)0x0) {
    (**(code **)(*(long *)&(piVar4->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 8))();
    if ((iMultiFab *)local_1b8._0_8_ != (iMultiFab *)0x0) {
      (*(((FabArray<amrex::IArrayBox> *)local_1b8._0_8_)->super_FabArrayBase)._vptr_FabArrayBase[1])
                ();
    }
  }
  lVar10 = (long)*(this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
  if (lVar10 == 1) {
    piVar4 = (this->m_owner_mask_top)._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
             super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
    local_220.m_bat._0_8_ = local_220.m_bat._0_8_ & 0xffffffff00000000;
    local_288.m_bat._0_8_ = local_288.m_bat._0_8_ & 0xffffffff00000000;
    local_2b4._0_4_ = (piVar4->super_FabArray<amrex::IArrayBox>).super_FabArrayBase.n_comp;
    std::make_unique<amrex::iMultiFab,amrex::iMultiFab&,amrex::MakeType,int,int>
              ((iMultiFab *)local_1b8,(MakeType *)piVar4,(int *)&local_220,(int *)&local_288);
  }
  else {
    lVar10 = lVar10 + -1;
    makeOwnerMask((MLNodeLinOp *)local_1b8,
                  (BoxArray *)
                  (lVar10 * 0x68 +
                  *(long *)&(((this->super_MLLinOp).m_grids.
                              super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>),
                  (DistributionMapping *)
                  (lVar10 * 0x10 +
                  *(long *)&(((this->super_MLLinOp).m_dmap.
                              super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                            ).
                            super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                  ),(Geometry *)
                    (lVar10 * 200 +
                    *(long *)&(((this->super_MLLinOp).m_geom.
                                super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>)
                 );
  }
  uVar9 = local_1b8._0_8_;
  local_1b8._0_8_ = (iMultiFab *)0x0;
  piVar4 = (this->m_owner_mask_bottom)._M_t.
           super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
           super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
  (this->m_owner_mask_bottom)._M_t.
  super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
  super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl = (iMultiFab *)uVar9;
  if (piVar4 != (iMultiFab *)0x0) {
    (**(code **)(*(long *)&(piVar4->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 8))();
    if ((iMultiFab *)local_1b8._0_8_ != (iMultiFab *)0x0) {
      (**(code **)(*(long *)&((FabArray<amrex::IArrayBox> *)local_1b8._0_8_)->super_FabArrayBase + 8
                  ))();
    }
  }
  std::
  vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::resize(&(this->m_cc_fine_mask).
            super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  std::
  vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::resize(&(this->m_nd_fine_mask).
            super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  std::
  vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
  ::resize(&(this->m_has_fine_bndry).
            super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  lVar10 = 0;
  lVar11 = 0;
  while( true ) {
    iVar1 = (this->super_MLLinOp).m_num_amr_levels;
    if (iVar1 <= lVar11) break;
    if (lVar11 < iVar1 + -1) {
      local_220.m_bat._0_8_ =
           (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)0x100000001;
      local_220.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)1;
      convert((BoxArray *)local_1b8,
              *(BoxArray **)
               ((long)&(((this->super_MLLinOp).m_grids.
                         super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar10),(IntVect *)&local_220);
      local_2b4._0_4_ = 1;
      local_2a0.vect._0_8_ = local_2a0.vect._0_8_ & 0xffffffff00000000;
      std::make_unique<amrex::iMultiFab,amrex::BoxArray,amrex::DistributionMapping&,int,int>
                (&local_288,(DistributionMapping *)local_1b8,
                 *(int **)((long)&(((this->super_MLLinOp).m_dmap.
                                    super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                    .
                                    super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                  ).
                                  super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar10),
                 (int *)local_2b4);
      uVar9 = local_288.m_bat._0_8_;
      puVar5 = (this->m_nd_fine_mask).
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_288.m_bat._0_8_ =
           (_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)0x0;
      tVar6.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
      super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
            &puVar5[lVar11]._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
      puVar5[lVar11]._M_t.
      super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> =
           (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)uVar9;
      if (tVar6.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
          super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl !=
          (_Head_base<0UL,_amrex::iMultiFab_*,_false>)0x0) {
        (**(code **)(*(long *)tVar6.
                              super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                              .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 8))()
        ;
      }
      if ((iMultiFab *)local_288.m_bat._0_8_ != (iMultiFab *)0x0) {
        (**(code **)(*(long *)local_288.m_bat._0_8_ + 8))();
      }
      local_288.m_bat._0_8_ =
           (_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)0x0;
      BoxArray::~BoxArray((BoxArray *)local_1b8);
      local_220.m_bat.m_bat_type = 1;
      local_288.m_bat.m_bat_type = 1;
      std::make_unique<amrex::iMultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int,int>
                ((BoxArray *)local_1b8,
                 *(DistributionMapping **)
                  ((long)&(((this->super_MLLinOp).m_grids.
                            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar10),
                 *(int **)((long)&(((this->super_MLLinOp).m_dmap.
                                    super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                    .
                                    super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                  ).
                                  super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar10),
                 (int *)&local_220);
      uVar9 = local_1b8._0_8_;
      puVar5 = (this->m_cc_fine_mask).
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1b8._0_8_ = (LayoutData<int> *)0x0;
      tVar6.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
      super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
            &puVar5[lVar11]._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
      puVar5[lVar11]._M_t.
      super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> =
           (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)uVar9;
      if (tVar6.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
          super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl !=
          (_Head_base<0UL,_amrex::iMultiFab_*,_false>)0x0) {
        (**(code **)(*(long *)tVar6.
                              super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                              .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 8))()
        ;
      }
      if ((LayoutData<int> *)local_1b8._0_8_ != (LayoutData<int> *)0x0) {
        (**(code **)((long)((FabArrayBase *)local_1b8._0_8_)->_vptr_FabArrayBase + 8))();
      }
    }
    else {
      local_288.m_bat.m_bat_type = 1;
      local_2b4._0_4_ = 1;
      local_1b8._16_8_ = 0;
      local_1b8._24_8_ = 0;
      local_1b8._0_8_ = (LayoutData<int> *)0x0;
      local_1b8._8_8_ = 0;
      local_1b8._32_8_ = 0;
      std::
      make_unique<amrex::iMultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int,int,amrex::MFInfo&>
                (&local_220,
                 *(DistributionMapping **)
                  ((long)&(((this->super_MLLinOp).m_grids.
                            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar10),
                 *(int **)((long)&(((this->super_MLLinOp).m_dmap.
                                    super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                    .
                                    super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                  ).
                                  super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar10),
                 (int *)&local_288,(MFInfo *)local_2b4);
      uVar9 = local_220.m_bat._0_8_;
      puVar5 = (this->m_cc_fine_mask).
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_220.m_bat._0_8_ =
           (_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)0x0;
      tVar6.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
      super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
            &puVar5[lVar11]._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
      puVar5[lVar11]._M_t.
      super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> =
           (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)uVar9;
      if (tVar6.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
          super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl !=
          (_Head_base<0UL,_amrex::iMultiFab_*,_false>)0x0) {
        (**(code **)(*(long *)tVar6.
                              super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                              .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 8))()
        ;
      }
      if ((_Head_base<0UL,_amrex::iMultiFab_*,_false>)local_220.m_bat._0_8_ !=
          (_Head_base<0UL,_amrex::iMultiFab_*,_false>)0x0) {
        (**(code **)(*(long *)local_220.m_bat._0_8_ + 8))();
      }
      local_220.m_bat._0_8_ =
           (_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1b8 + 0x10));
    }
    std::make_unique<amrex::LayoutData<int>,amrex::BoxArray&,amrex::DistributionMapping&>
              ((BoxArray *)local_1b8,
               *(DistributionMapping **)
                ((long)&(((this->super_MLLinOp).m_grids.
                          super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar10));
    uVar9 = local_1b8._0_8_;
    puVar7 = (this->m_has_fine_bndry).
             super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1b8._0_8_ = (iMultiFab *)0x0;
    tVar8.
    super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>.
    super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
           *)&puVar7[lVar11]._M_t.
              super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
    ;
    puVar7[lVar11]._M_t.
    super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_> =
         (__uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>)
         uVar9;
    if (tVar8.
        super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
        .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::LayoutData<int>_*,_false>)0x0) {
      (**(code **)(*(long *)tVar8.
                            super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
                            .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl + 8
                  ))();
    }
    if ((iMultiFab *)local_1b8._0_8_ != (iMultiFab *)0x0) {
      (**(code **)(*(long *)&((FabArray<amrex::IArrayBox> *)local_1b8._0_8_)->super_FabArrayBase + 8
                  ))();
    }
    lVar11 = lVar11 + 1;
    lVar10 = lVar10 + 0x18;
  }
  std::
  vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::resize(&(this->m_norm_fine_mask).
            super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ,(long)iVar1 - 1);
  lVar11 = 0;
  for (lVar10 = 0; lVar10 < (long)(this->super_MLLinOp).m_num_amr_levels + -1; lVar10 = lVar10 + 1)
  {
    local_2b4._0_8_ = 0x100000001;
    local_2b4._8_4_ = 1;
    convert(&local_220,
            *(BoxArray **)
             ((long)&(((this->super_MLLinOp).m_grids.
                       super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                     super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar11),(IntVect *)local_2b4);
    cdm = *(DistributionMapping **)
           ((long)&(((this->super_MLLinOp).m_dmap.
                     super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                   ).
                   super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar11);
    local_2a0.vect[0] = 1;
    local_2a0.vect[1] = 1;
    local_2a0.vect[2] = 1;
    convert(&local_288,
            *(BoxArray **)
             ((long)&(this->super_MLLinOp).m_grids.
                     super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].
                     super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                     super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar11),&local_2a0);
    local_294.vect[0] =
         (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         [lVar10];
    local_294.vect[1] = local_294.vect[0];
    local_294.vect[2] = local_294.vect[0];
    makeFineMask((iMultiFab *)local_1b8,&local_220,cdm,&local_288,&local_294,1,0);
    std::make_unique<amrex::iMultiFab,amrex::iMultiFab>((iMultiFab *)(local_2b4 + 0xc));
    uVar9 = local_2b4._12_8_;
    puVar5 = (this->m_norm_fine_mask).
             super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_2b4._12_8_ = (long *)0x0;
    tVar6.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
    super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
          &puVar5[lVar10]._M_t.
           super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
    puVar5[lVar10]._M_t.
    super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> =
         (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)uVar9;
    if (tVar6.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::iMultiFab_*,_false>)0x0) {
      (**(code **)(*(long *)tVar6.
                            super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                            .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 8))();
    }
    if ((long *)local_2b4._12_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_2b4._12_8_ + 8))();
    }
    local_2b4._12_8_ = (iMultiFab *)0x0;
    iMultiFab::~iMultiFab((iMultiFab *)local_1b8);
    BoxArray::~BoxArray(&local_288);
    BoxArray::~BoxArray(&local_220);
    lVar11 = lVar11 + 0x18;
  }
  return;
}

Assistant:

void
MLNodeLinOp::define (const Vector<Geometry>& a_geom,
                     const Vector<BoxArray>& a_grids,
                     const Vector<DistributionMapping>& a_dmap,
                     const LPInfo& a_info,
                     const Vector<FabFactory<FArrayBox> const*>& a_factory,
                     int a_eb_limit_coarsening)
{
    bool eb_limit_coarsening;
    if (a_eb_limit_coarsening < 0) { // default
#if defined(AMREX_USE_HYPRE) && (AMREX_SPACEDIM > 1)
        eb_limit_coarsening = true;
#else
        eb_limit_coarsening = false;
#endif
    } else {
        eb_limit_coarsening = a_eb_limit_coarsening;
    }

    MLLinOp::define(a_geom, a_grids, a_dmap, a_info, a_factory, eb_limit_coarsening);

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(!hasHiddenDimension(),
                                     "Nodal solver cannot have any hidden dimensions");

    m_dirichlet_mask.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        m_dirichlet_mask[amrlev].resize(m_num_mg_levels[amrlev]);
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            m_dirichlet_mask[amrlev][mglev] = std::make_unique<iMultiFab>
                (amrex::convert(m_grids[amrlev][mglev],IntVect::TheNodeVector()),
                 m_dmap[amrlev][mglev], 1, 0);
            m_dirichlet_mask[amrlev][mglev]->setVal(0); // non-Dirichlet by default
        }
    }

    m_owner_mask_top = makeOwnerMask(m_grids[0][0],
                                      m_dmap[0][0],
                                      m_geom[0][0]);
    if (m_num_mg_levels[0] == 1) {
        m_owner_mask_bottom = std::make_unique<iMultiFab>(*m_owner_mask_top, amrex::make_alias, 0,
                                                          m_owner_mask_top->nComp());
    } else {
        m_owner_mask_bottom = makeOwnerMask(m_grids[0][m_num_mg_levels[0]-1],
                                             m_dmap[0][m_num_mg_levels[0]-1],
                                             m_geom[0][m_num_mg_levels[0]-1]);
    }

    m_cc_fine_mask.resize(m_num_amr_levels);
    m_nd_fine_mask.resize(m_num_amr_levels);
    m_has_fine_bndry.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        if (amrlev < m_num_amr_levels-1)
        {
            m_nd_fine_mask[amrlev] = std::make_unique<iMultiFab>
                (amrex::convert(m_grids[amrlev][0],IntVect::TheNodeVector()),
                 m_dmap[amrlev][0], 1, 0);
            m_cc_fine_mask[amrlev] = std::make_unique<iMultiFab>
                (m_grids[amrlev][0], m_dmap[amrlev][0], 1, 1);
        } else {
            m_cc_fine_mask[amrlev] = std::make_unique<iMultiFab>
                (m_grids[amrlev][0], m_dmap[amrlev][0], 1, 1, MFInfo().SetAlloc(false));
        }
        m_has_fine_bndry[amrlev] = std::make_unique<LayoutData<int> >(m_grids[amrlev][0],
                                                                      m_dmap[amrlev][0]);
    }

    m_norm_fine_mask.resize(m_num_amr_levels-1);
    for (int amrlev = 0; amrlev < m_num_amr_levels-1; ++amrlev) {
        m_norm_fine_mask[amrlev] = std::make_unique<iMultiFab>
            (makeFineMask(amrex::convert(m_grids[amrlev][0], IntVect(1)), m_dmap[amrlev][0],
                          amrex::convert(m_grids[amrlev+1][0], IntVect(1)),
                          IntVect(m_amr_ref_ratio[amrlev]), 1, 0));
    }
}